

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

bool __thiscall
MutableS2ShapeIndex::MakeIndexCell
          (MutableS2ShapeIndex *this,S2PaddedCell *pcell,
          vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
          *edges,InteriorTracker *tracker)

{
  long lVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  uint n;
  S2ShapeIndexCell *this_00;
  S2ClippedShape *pSVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  S2ClippedShape *this_01;
  ulong uVar9;
  ulong uVar10;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar11;
  pointer piVar12;
  int iVar13;
  const_iterator __begin1;
  pointer ppCVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  const_iterator __end1;
  vector<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
  *__range1;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar18;
  int32 shape_id;
  ulong uVar19;
  iterator position;
  S2Point local_48;
  
  ppCVar2 = (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar2 == ppCVar3) &&
     ((tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar8 = true;
  }
  else {
    iVar13 = 0;
    ppCVar14 = ppCVar2;
    do {
      if (ppCVar14 == ppCVar3) {
        if ((ppCVar2 != ppCVar3) && (tracker->is_active_ != false)) {
          uVar16 = (pcell->id_).id_;
          if (uVar16 - (~uVar16 & uVar16 - 1) != (tracker->next_cellid_).id_) {
            S2PaddedCell::GetEntryVertex(&local_48,pcell);
            (tracker->b_).c_[2] = local_48.c_[2];
            (tracker->b_).c_[0] = local_48.c_[0];
            (tracker->b_).c_[1] = local_48.c_[1];
          }
          S2PaddedCell::GetCenter(&local_48,pcell);
          InteriorTracker::DrawTo(tracker,&local_48);
          TestAllEdges(edges,tracker);
        }
        n = CountShapes(edges,&tracker->shape_ids_);
        this_00 = (S2ShapeIndexCell *)operator_new(0x10);
        *(undefined8 *)
         &(this_00->shapes_).
          super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> = 0;
        (this_00->shapes_).super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>
        .field_7.pointer_ = (S2ClippedShape *)0x0;
        pSVar4 = S2ShapeIndexCell::add_shapes(this_00,n);
        piVar12 = (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar15 = 0;
        uVar16 = (ulong)n;
        if ((int)n < 1) {
          uVar16 = uVar15;
        }
        paVar18 = &pSVar4->field_3;
        uVar10 = 0;
        for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
          iVar17 = (int)uVar10;
          uVar19 = (ulong)iVar17;
          ppCVar2 = (edges->
                    super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar5 = (long)(edges->
                        super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3;
          iVar13 = (int)((ulong)((long)(this->shapes_).
                                       super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->shapes_).
                                      super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
          shape_id = iVar13;
          if (uVar5 != uVar19) {
            shape_id = ppCVar2[uVar19]->face_edge->shape_id;
          }
          if (piVar12 !=
              (tracker->shape_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar13 = *piVar12;
          }
          this_01 = pSVar4 + uVar15;
          if (iVar13 < shape_id) {
            this_01->shape_id_ = iVar13;
            *(undefined4 *)&this_01->field_0x4 = 1;
            piVar12 = piVar12 + 1;
          }
          else {
            uVar6 = uVar19;
            uVar9 = uVar19;
            if (uVar19 < uVar5) {
              uVar9 = uVar5;
            }
            while ((uVar10 = uVar9, uVar6 < uVar5 &&
                   (uVar10 = uVar6, ppCVar2[uVar6]->face_edge->shape_id == shape_id))) {
              uVar6 = uVar6 + 1;
            }
            S2ClippedShape::Init(this_01,shape_id,(int)uVar10 - iVar17);
            lVar1 = uVar19 * 8;
            ppCVar2 = (edges->
                      super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar7 = 0;
            for (; (long)uVar19 < (long)(int)uVar10; uVar19 = uVar19 + 1) {
              paVar11 = paVar18;
              if (5 < *(uint *)&this_01->field_0x4) {
                paVar11 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(this_01->field_3).edges_;
              }
              *(undefined4 *)((long)paVar11 + lVar7) =
                   *(undefined4 *)(**(long **)((long)ppCVar2 + lVar7 * 2 + lVar1) + 4);
              lVar7 = lVar7 + 4;
            }
            if (iVar13 == shape_id) {
              this_01->field_0x4 = this_01->field_0x4 | 1;
              piVar12 = piVar12 + 1;
            }
          }
          paVar18 = paVar18 + 2;
        }
        position = gtl::internal_btree::
                   btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                          *)&this->cell_map_);
        local_48.c_[0] = (VType)(pcell->id_).id_;
        local_48.c_[1] = (VType)this_00;
        gtl::internal_btree::
        btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
        ::insert((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                  *)&this->cell_map_,position,(value_type *)&local_48);
        if (tracker->is_active_ == false) {
          return true;
        }
        if ((edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_start ==
            (edges->
            super__Vector_base<const_MutableS2ShapeIndex::ClippedEdge_*,_std::allocator<const_MutableS2ShapeIndex::ClippedEdge_*>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        S2PaddedCell::GetExitVertex(&local_48,pcell);
        InteriorTracker::DrawTo(tracker,&local_48);
        TestAllEdges(edges,tracker);
        uVar15 = (pcell->id_).id_;
        uVar16 = uVar15 + (-uVar15 & uVar15) * 2;
        (tracker->next_cellid_).id_ = uVar16 - (~uVar16 & (uVar15 + (-uVar15 & uVar15) * 2) - 1);
        return true;
      }
      iVar13 = iVar13 + (uint)(pcell->level_ < (*ppCVar14)->face_edge->max_level);
      ppCVar14 = ppCVar14 + 1;
    } while (iVar13 <= (this->options_).max_edges_per_cell_);
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool MutableS2ShapeIndex::MakeIndexCell(const S2PaddedCell& pcell,
                                        const vector<const ClippedEdge*>& edges,
                                        InteriorTracker* tracker) {
  if (edges.empty() && tracker->shape_ids().empty()) {
    // No index cell is needed.  (In most cases this situation is detected
    // before we get to this point, but this can happen when all shapes in a
    // cell are removed.)
    return true;
  }

  // Count the number of edges that have not reached their maximum level yet.
  // Return false if there are too many such edges.
  int count = 0;
  for (const ClippedEdge* edge : edges) {
    count += (pcell.level() < edge->face_edge->max_level);
    if (count > options_.max_edges_per_cell())
      return false;
  }

  // Possible optimization: Continue subdividing as long as exactly one child
  // of "pcell" intersects the given edges.  This can be done by finding the
  // bounding box of all the edges and calling ShrinkToFit():
  //
  // S2CellId cellid = pcell.ShrinkToFit(GetRectBound(edges));
  //
  // Currently this is not beneficial; it slows down construction by 4-25%
  // (mainly computing the union of the bounding rectangles) and also slows
  // down queries (since more recursive clipping is required to get down to
  // the level of a spatial index cell).  But it may be worth trying again
  // once "contains_center" is computed and all algorithms are modified to
  // take advantage of it.

  // We update the InteriorTracker as follows.  For every S2Cell in the index
  // we construct two edges: one edge from entry vertex of the cell to its
  // center, and one from the cell center to its exit vertex.  Here "entry"
  // and "exit" refer the S2CellId ordering, i.e. the order in which points
  // are encountered along the S2 space-filling curve.  The exit vertex then
  // becomes the entry vertex for the next cell in the index, unless there are
  // one or more empty intervening cells, in which case the InteriorTracker
  // state is unchanged because the intervening cells have no edges.

  // Shift the InteriorTracker focus point to the center of the current cell.
  if (tracker->is_active() && !edges.empty()) {
    if (!tracker->at_cellid(pcell.id())) {
      tracker->MoveTo(pcell.GetEntryVertex());
    }
    tracker->DrawTo(pcell.GetCenter());
    TestAllEdges(edges, tracker);
  }
  // Allocate and fill a new index cell.  To get the total number of shapes we
  // need to merge the shapes associated with the intersecting edges together
  // with the shapes that happen to contain the cell center.
  const ShapeIdSet& cshape_ids = tracker->shape_ids();
  int num_shapes = CountShapes(edges, cshape_ids);
  S2ShapeIndexCell* cell = new S2ShapeIndexCell;
  S2ClippedShape* base = cell->add_shapes(num_shapes);

  // To fill the index cell we merge the two sources of shapes: "edge shapes"
  // (those that have at least one edge that intersects this cell), and
  // "containing shapes" (those that contain the cell center).  We keep track
  // of the index of the next intersecting edge and the next containing shape
  // as we go along.  Both sets of shape ids are already sorted.
  int enext = 0;
  ShapeIdSet::const_iterator cnext = cshape_ids.begin();
  for (int i = 0; i < num_shapes; ++i) {
    S2ClippedShape* clipped = base + i;
    int eshape_id = num_shape_ids(), cshape_id = eshape_id;  // Sentinels
    if (enext != edges.size()) {
      eshape_id = edges[enext]->face_edge->shape_id;
    }
    if (cnext != cshape_ids.end()) {
      cshape_id = *cnext;
    }
    int ebegin = enext;
    if (cshape_id < eshape_id) {
      // The entire cell is in the shape interior.
      clipped->Init(cshape_id, 0);
      clipped->set_contains_center(true);
      ++cnext;
    } else {
      // Count the number of edges for this shape and allocate space for them.
      while (enext < edges.size() &&
             edges[enext]->face_edge->shape_id == eshape_id) {
        ++enext;
      }
      clipped->Init(eshape_id, enext - ebegin);
      for (int e = ebegin; e < enext; ++e) {
        clipped->set_edge(e - ebegin, edges[e]->face_edge->edge_id);
      }
      if (cshape_id == eshape_id) {
        clipped->set_contains_center(true);
        ++cnext;
      }
    }
  }
  // UpdateEdges() visits cells in increasing order of S2CellId, so during
  // initial construction of the index all insertions happen at the end.  It
  // is much faster to give an insertion hint in this case.  Otherwise the
  // hint doesn't do much harm.  With more effort we could provide a hint even
  // during incremental updates, but this is probably not worth the effort.
  cell_map_.insert(cell_map_.end(), std::make_pair(pcell.id(), cell));

  // Shift the InteriorTracker focus point to the exit vertex of this cell.
  if (tracker->is_active() && !edges.empty()) {
    tracker->DrawTo(pcell.GetExitVertex());
    TestAllEdges(edges, tracker);
    tracker->set_next_cellid(pcell.id().next());
  }
  return true;
}